

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O2

Pipeline * __thiscall
n_e_s::core::Mos6502::create_eor_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,Opcode opcode)

{
  MemoryAccess access;
  undefined1 local_78 [16];
  code *local_68;
  code *local_60;
  
  access = get_memory_access(opcode.family);
  Pipeline::Pipeline(__return_storage_ptr__);
  create_addressing_steps((Pipeline *)local_78,this,opcode.address_mode,access);
  Pipeline::append(__return_storage_ptr__,(Pipeline *)local_78);
  std::
  deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ::~deque((deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
            *)(local_78 + 8));
  local_78._8_8_ = (_Map_pointer)0x0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:932:17)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:932:17)>
             ::_M_manager;
  local_78._0_8_ = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)local_78);
  std::_Function_base::~_Function_base((_Function_base *)local_78);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_eor_instruction(Opcode opcode) {
    const MemoryAccess memory_access = get_memory_access(opcode.family);
    Pipeline result;
    result.append(create_addressing_steps(opcode.address_mode, memory_access));

    result.push([this] {
        const uint8_t operand = mmu_->read_byte(effective_address_);
        registers_->a ^= operand;

        set_zero(registers_->a);
        set_negative(registers_->a);
    });

    return result;
}